

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.h
# Opt level: O2

void __thiscall LineReader<true>::iterator::iterator(iterator *this,File *f,ssize_t offset)

{
  string local_38;
  
  this->f_ = f;
  this->offset_ = offset;
  (this->line)._M_dataplus._M_p = (pointer)&(this->line).field_2;
  (this->line)._M_string_length = 0;
  (this->line).field_2._M_local_buf[0] = '\0';
  if (-1 < offset) {
    File::seek(f,offset,0);
  }
  File::readLine_abi_cxx11_(&local_38,f);
  std::__cxx11::string::operator=((string *)&this->line,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

iterator(File& f, ssize_t offset) : f_(f), offset_(offset)
        {
            if (offset >= 0)
                f.seek(offset);
            line = f.readLine();
        }